

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcS.c
# Opt level: O1

int Bmcs_ManPerform_Solve
              (Bmcs_Man_t *p,int iLit,pthread_t *WorkerThread,Par_ThData_t *ThData,int nProcs,
              int *pSolver)

{
  int iVar1;
  int *piVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  
  uVar3 = (ulong)(uint)nProcs;
  if (0 < nProcs) {
    lVar5 = 0;
    do {
      *(int *)((long)&ThData->iLit + lVar5) = iLit;
      if (*(int *)((long)&ThData->fWorking + lVar5) != 0) {
        __assert_fail("ThData[i].fWorking == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcBmcS.c"
                      ,0x306,
                      "int Bmcs_ManPerform_Solve(Bmcs_Man_t *, int, pthread_t *, Par_ThData_t *, int, int *)"
                     );
      }
      lVar5 = lVar5 + 0x18;
    } while (uVar3 * 0x18 != lVar5);
  }
  if (nProcs < 1) {
    uVar4 = 0;
  }
  else {
    piVar2 = &ThData->fWorking;
    uVar4 = 0;
    do {
      *piVar2 = 1;
      uVar4 = uVar4 + 1;
      piVar2 = piVar2 + 6;
    } while (uVar3 != uVar4);
  }
  iVar1 = -1;
  if ((int)uVar4 == nProcs) {
    do {
      if (nProcs < 1) {
        uVar4 = 0;
      }
      else {
        uVar4 = 0;
        piVar2 = &ThData->status;
        do {
          if (piVar2[-1] == 0) {
            p->fStopNow = 1;
            iVar1 = *piVar2;
            *pSolver = (int)uVar4;
            goto LAB_00570d51;
          }
          uVar4 = uVar4 + 1;
          piVar2 = piVar2 + 6;
        } while (uVar3 != uVar4);
        uVar4 = (ulong)(uint)nProcs;
      }
LAB_00570d51:
    } while ((int)uVar4 == nProcs);
  }
  if (0 < nProcs) {
    lVar5 = 0;
    do {
      *(undefined4 *)((long)&ThData->iLit + lVar5) = 0xffffffff;
      if (*(int *)((long)&ThData->fWorking + lVar5) != 0) {
        __assert_fail("ThData[i].fWorking == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcBmcS.c"
                      ,0x325,
                      "int Bmcs_ManPerform_Solve(Bmcs_Man_t *, int, pthread_t *, Par_ThData_t *, int, int *)"
                     );
      }
      lVar5 = lVar5 + 0x18;
    } while (uVar3 * 0x18 != lVar5);
  }
  p->fStopNow = 0;
  return iVar1;
}

Assistant:

int Bmcs_ManPerform_Solve( Bmcs_Man_t * p, int iLit, pthread_t * WorkerThread, Par_ThData_t * ThData, int nProcs, int * pSolver )
{
    int i, status = -1;
    // set new problem
    for ( i = 0; i < nProcs; i++ )
    {
        ThData[i].iLit = iLit;
        assert( ThData[i].fWorking == 0 );
    }
    // start solvers on a new problem
    for ( i = 0; i < nProcs; i++ )
        ThData[i].fWorking = 1;
    // check if any of the solvers finished
    while ( i == nProcs )
    {
        for ( i = 0; i < nProcs; i++ )
        {
            if ( ThData[i].fWorking )
                continue;
            // set stop request
            p->fStopNow = 1;
            // remember status
            status = ThData[i].status;
            //printf( "Solver %d returned status %d.\n", i, status );
            *pSolver = i;
            break;
        }
    }
    // wait till threads finish
    while ( i < nProcs )
    {
        for ( i = 0; i < nProcs; i++ )
            if ( ThData[i].fWorking )
                break;
    }
    for ( i = 0; i < nProcs; i++ )
    {
        ThData[i].iLit = -1;
        assert( ThData[i].fWorking == 0 );
    }
    // reset stop request
    p->fStopNow = 0;
    return status;
}